

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_initbang(_glist *x)

{
  _glist *x_00;
  t_gobj *x_01;
  t_symbol *s;
  t_gotfn p_Var1;
  
  s = gensym("loadbang");
  for (x_00 = (_glist *)x->gl_list; x_00 != (_glist *)0x0;
      x_00 = (_glist *)(x_00->gl_obj).te_g.g_next) {
    if (((x_00->gl_obj).te_g.g_pd == canvas_class) && (x_00->gl_env == (_canvasenvironment *)0x0)) {
      canvas_initbang(x_00);
    }
  }
  for (x_01 = x->gl_list; x_01 != (t_gobj *)0x0; x_01 = x_01->g_next) {
    if ((x_01->g_pd != canvas_class) && (p_Var1 = zgetfn(&x_01->g_pd,s), p_Var1 != (t_gotfn)0x0)) {
      pd_vmess(&x_01->g_pd,s,"f",0x3ff0000000000000);
    }
  }
  return;
}

Assistant:

void canvas_initbang(t_canvas *x)
{
    t_gobj *y;
    t_symbol *s = gensym("loadbang");
    /* run "initbang" for all subpatches, but NOT for the child abstractions */
    for (y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == canvas_class &&
            !canvas_isabstraction((t_canvas *)y))
                canvas_initbang((t_canvas *)y);
    /* call the initbang()-method for objects that have one */
    for (y = x->gl_list; y; y = y->g_next)
        if ((pd_class(&y->g_pd) != canvas_class) && zgetfn(&y->g_pd, s))
            pd_vmess(&y->g_pd, s, "f", (t_floatarg)LB_INIT);
}